

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

void KINForcingTerm(KINMem kin_mem,sunrealtype fnormp)

{
  int iVar1;
  double dVar2;
  double dVar3;
  sunrealtype sVar4;
  double dVar5;
  
  iVar1 = kin_mem->kin_etaflag;
  if (iVar1 == 1) {
    dVar2 = kin_mem->kin_sJpnorm * kin_mem->kin_sJpnorm +
            kin_mem->kin_fnorm * kin_mem->kin_fnorm + kin_mem->kin_sFdotJp + kin_mem->kin_sFdotJp;
    dVar5 = 0.0;
    if (0.0 < dVar2) {
      if (dVar2 < 0.0) {
        dVar5 = sqrt(dVar2);
      }
      else {
        dVar5 = SQRT(dVar2);
      }
    }
    dVar2 = pow(kin_mem->kin_eta,kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = ABS(fnormp - dVar5) / kin_mem->kin_fnorm;
    iVar1 = kin_mem->kin_etaflag;
  }
  else {
    dVar2 = 0.5;
  }
  if (iVar1 == 2) {
    dVar5 = kin_mem->kin_eta_gamma;
    dVar2 = pow(kin_mem->kin_eta,kin_mem->kin_eta_alpha);
    dVar2 = dVar2 * dVar5;
    dVar5 = kin_mem->kin_eta_gamma;
    dVar3 = pow(fnormp / kin_mem->kin_fnorm,kin_mem->kin_eta_alpha);
    sVar4 = dVar3 * dVar5;
  }
  else {
    sVar4 = kin_mem->kin_eta;
  }
  dVar2 = (double)(~-(ulong)(dVar2 < 0.1) & (ulong)dVar2);
  if (sVar4 <= dVar2) {
    sVar4 = dVar2;
  }
  if (sVar4 <= 0.0001) {
    sVar4 = 0.0001;
  }
  if (0.9 <= sVar4) {
    sVar4 = 0.9;
  }
  kin_mem->kin_eta = sVar4;
  return;
}

Assistant:

static void KINForcingTerm(KINMem kin_mem, sunrealtype fnormp)
{
  sunrealtype eta_max, eta_min, eta_safe, linmodel_norm;

  eta_max  = POINT9;
  eta_min  = POINT0001;
  eta_safe = HALF;

  /* choice #1 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE1)
  {
    /* compute the norm of f + Jp , scaled L2 norm */

    linmodel_norm = SUNRsqrt((kin_mem->kin_fnorm * kin_mem->kin_fnorm) +
                             (TWO * kin_mem->kin_sFdotJp) +
                             (kin_mem->kin_sJpnorm * kin_mem->kin_sJpnorm));

    /* form the safeguarded for choice #1 */

    eta_safe         = SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = SUNRabs(fnormp - linmodel_norm) / kin_mem->kin_fnorm;
  }

  /* choice #2 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE2)
  {
    eta_safe = kin_mem->kin_eta_gamma *
               SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);

    kin_mem->kin_eta = kin_mem->kin_eta_gamma *
                       SUNRpowerR((fnormp / kin_mem->kin_fnorm),
                                  kin_mem->kin_eta_alpha);
  }

  /* apply safeguards */

  if (eta_safe < POINT1) { eta_safe = ZERO; }
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_safe);
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_min);
  kin_mem->kin_eta = SUNMIN(kin_mem->kin_eta, eta_max);

  return;
}